

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O3

bool __thiscall AgenPeeps::IsMemoryOpnd(AgenPeeps *this,Opnd *opnd)

{
  OpndKind OVar1;
  bool bVar2;
  
  OVar1 = IR::Opnd::GetKind(opnd);
  bVar2 = true;
  if (OVar1 != OpndKindSym) {
    OVar1 = IR::Opnd::GetKind(opnd);
    if (OVar1 != OpndKindIndir) {
      OVar1 = IR::Opnd::GetKind(opnd);
      bVar2 = OVar1 == OpndKindMemRef;
    }
  }
  return bVar2;
}

Assistant:

bool AgenPeeps::IsMemoryOpnd(IR::Opnd *opnd)
{
    return opnd->IsSymOpnd() || opnd->IsIndirOpnd() || opnd->IsMemRefOpnd();
}